

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O0

void __thiscall HyperGraph::HyperGraph(HyperGraph *this,Graph *graph)

{
  Graph *graph_local;
  HyperGraph *this_local;
  
  this->__numRRsets = 0;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->__vecVisitBool);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->__vecVisitNode);
  this->_graph = graph;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_FRsets);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->_RRsets);
  this->_cascadeModel = IC;
  init_hypergraph(this);
  return;
}

Assistant:

explicit HyperGraph(const Graph& graph) : _graph(graph)
    {
        init_hypergraph();
    }